

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O1

void __thiscall
NumericArgTest_MakeAndVisit_Test<int>::TestBody(NumericArgTest_MakeAndVisit_Test<int> *this)

{
  mock_visitor<int> *pmVar1;
  MockSpec<test_result_(int)> *pMVar2;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<int>_> visitor;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  local_108;
  StrictMock<mock_visitor<int>_> local_e0;
  
  testing::StrictMock<mock_visitor<int>_>::StrictMock(&local_e0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_108,0x2a);
  pmVar1 = &local_e0.super_mock_visitor<int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<int> *)&local_108);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x152,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d7120;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = int_type;
  local_108.value_.field_0.long_long_value = (longlong)&DAT_0000002a;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_108);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(&local_e0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_108,0x2a);
  pmVar1 = &local_e0.super_mock_visitor<int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<int> *)&local_108);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x152,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d7120;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = int_type;
  local_108.value_.field_0.long_long_value = (longlong)&DAT_0000002a;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,&local_108);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(&local_e0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_108,-0x80000000);
  pmVar1 = &local_e0.super_mock_visitor<int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<int> *)&local_108);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x153,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d7120;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = int_type;
  local_108.value_.field_0.long_long_value = 0x80000000;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_108);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(&local_e0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_108,-0x80000000);
  pmVar1 = &local_e0.super_mock_visitor<int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<int> *)&local_108);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x153,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d7120;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = int_type;
  local_108.value_.field_0.long_long_value = 0x80000000;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,&local_108);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(&local_e0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_108,0x7fffffff);
  pmVar1 = &local_e0.super_mock_visitor<int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<int> *)&local_108);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x154,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d7120;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = int_type;
  local_108.value_.field_0.long_long_value = 0x7fffffff;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_108);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(&local_e0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_108,0x7fffffff);
  pmVar1 = &local_e0.super_mock_visitor<int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<int> *)&local_108);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x154,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d7120;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = int_type;
  local_108.value_.field_0.long_long_value = 0x7fffffff;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,&local_108);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(&local_e0);
  return;
}

Assistant:

TYPED_TEST(NumericArgTest, MakeAndVisit) {
  CHECK_ARG(test_value<TypeParam>(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::min(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::max(), typename);
}